

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_seq_parameter_set_svc_extension(sps_subset_t *sps_subset,bs_t *b)

{
  sps_svc_ext_t *psVar1;
  uint32_t uVar2;
  int32_t iVar3;
  FILE *local_f0;
  FILE *local_e8;
  FILE *local_e0;
  FILE *local_d8;
  FILE *local_d0;
  FILE *local_c8;
  FILE *local_c0;
  FILE *local_b8;
  FILE *local_b0;
  FILE *local_a8;
  FILE *local_a0;
  FILE *local_98;
  FILE *local_90;
  FILE *local_88;
  FILE *local_80;
  FILE *local_78;
  FILE *local_70;
  FILE *local_68;
  FILE *local_60;
  FILE *local_58;
  FILE *local_50;
  FILE *local_48;
  FILE *local_40;
  FILE *local_38;
  FILE *local_30;
  FILE *local_28;
  sps_svc_ext_t *sps_svc_ext;
  bs_t *b_local;
  sps_subset_t *sps_subset_local;
  
  psVar1 = (sps_subset->field_1).sps_svc_ext;
  if (h264_dbgfile == (FILE *)0x0) {
    local_28 = _stdout;
  }
  else {
    local_28 = (FILE *)h264_dbgfile;
  }
  fprintf(local_28,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u1(b);
  psVar1->inter_layer_deblocking_filter_control_present_flag = uVar2 != 0;
  if (h264_dbgfile == (FILE *)0x0) {
    local_30 = _stdout;
  }
  else {
    local_30 = (FILE *)h264_dbgfile;
  }
  fprintf(local_30,"sps_svc_ext->inter_layer_deblocking_filter_control_present_flag: %d \n",
          (ulong)(psVar1->inter_layer_deblocking_filter_control_present_flag & 1));
  if (h264_dbgfile == (FILE *)0x0) {
    local_38 = _stdout;
  }
  else {
    local_38 = (FILE *)h264_dbgfile;
  }
  fprintf(local_38,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u(b,2);
  psVar1->extended_spatial_scalability_idc = (uchar)uVar2;
  if (h264_dbgfile == (FILE *)0x0) {
    local_40 = _stdout;
  }
  else {
    local_40 = (FILE *)h264_dbgfile;
  }
  fprintf(local_40,"sps_svc_ext->extended_spatial_scalability_idc: %d \n",
          (ulong)psVar1->extended_spatial_scalability_idc);
  if ((sps_subset->sps->chroma_format_idc == 1) || (sps_subset->sps->chroma_format_idc == 2)) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_48 = _stdout;
    }
    else {
      local_48 = (FILE *)h264_dbgfile;
    }
    fprintf(local_48,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = bs_read_u1(b);
    psVar1->chroma_phase_x_plus1_flag = uVar2 != 0;
    if (h264_dbgfile == (FILE *)0x0) {
      local_50 = _stdout;
    }
    else {
      local_50 = (FILE *)h264_dbgfile;
    }
    fprintf(local_50,"sps_svc_ext->chroma_phase_x_plus1_flag: %d \n",
            (ulong)(psVar1->chroma_phase_x_plus1_flag & 1));
  }
  if (sps_subset->sps->chroma_format_idc == 1) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_58 = _stdout;
    }
    else {
      local_58 = (FILE *)h264_dbgfile;
    }
    fprintf(local_58,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = bs_read_u(b,2);
    psVar1->chroma_phase_y_plus1 = (uchar)uVar2;
    if (h264_dbgfile == (FILE *)0x0) {
      local_60 = _stdout;
    }
    else {
      local_60 = (FILE *)h264_dbgfile;
    }
    fprintf(local_60,"sps_svc_ext->chroma_phase_y_plus1: %d \n",(ulong)psVar1->chroma_phase_y_plus1)
    ;
  }
  if (psVar1->extended_spatial_scalability_idc != '\0') {
    if (0 < sps_subset->sps->chroma_format_idc) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_68 = _stdout;
      }
      else {
        local_68 = (FILE *)h264_dbgfile;
      }
      fprintf(local_68,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar2 = bs_read_u1(b);
      psVar1->seq_ref_layer_chroma_phase_x_plus1_flag = uVar2 != 0;
      if (h264_dbgfile == (FILE *)0x0) {
        local_70 = _stdout;
      }
      else {
        local_70 = (FILE *)h264_dbgfile;
      }
      fprintf(local_70,"sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag: %d \n",
              (ulong)(psVar1->seq_ref_layer_chroma_phase_x_plus1_flag & 1));
      if (h264_dbgfile == (FILE *)0x0) {
        local_78 = _stdout;
      }
      else {
        local_78 = (FILE *)h264_dbgfile;
      }
      fprintf(local_78,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar2 = bs_read_u(b,2);
      psVar1->seq_ref_layer_chroma_phase_y_plus1 = (uchar)uVar2;
      if (h264_dbgfile == (FILE *)0x0) {
        local_80 = _stdout;
      }
      else {
        local_80 = (FILE *)h264_dbgfile;
      }
      fprintf(local_80,"sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1: %d \n",
              (ulong)psVar1->seq_ref_layer_chroma_phase_y_plus1);
    }
    if (h264_dbgfile == (FILE *)0x0) {
      local_88 = _stdout;
    }
    else {
      local_88 = (FILE *)h264_dbgfile;
    }
    fprintf(local_88,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_left_offset = iVar3;
    if (h264_dbgfile == (FILE *)0x0) {
      local_90 = _stdout;
    }
    else {
      local_90 = (FILE *)h264_dbgfile;
    }
    fprintf(local_90,"sps_svc_ext->seq_scaled_ref_layer_left_offset: %d \n",
            (ulong)(uint)psVar1->seq_scaled_ref_layer_left_offset);
    if (h264_dbgfile == (FILE *)0x0) {
      local_98 = _stdout;
    }
    else {
      local_98 = (FILE *)h264_dbgfile;
    }
    fprintf(local_98,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_top_offset = iVar3;
    if (h264_dbgfile == (FILE *)0x0) {
      local_a0 = _stdout;
    }
    else {
      local_a0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_a0,"sps_svc_ext->seq_scaled_ref_layer_top_offset: %d \n",
            (ulong)(uint)psVar1->seq_scaled_ref_layer_top_offset);
    if (h264_dbgfile == (FILE *)0x0) {
      local_a8 = _stdout;
    }
    else {
      local_a8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_a8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_right_offset = iVar3;
    if (h264_dbgfile == (FILE *)0x0) {
      local_b0 = _stdout;
    }
    else {
      local_b0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_b0,"sps_svc_ext->seq_scaled_ref_layer_right_offset: %d \n",
            (ulong)(uint)psVar1->seq_scaled_ref_layer_right_offset);
    if (h264_dbgfile == (FILE *)0x0) {
      local_b8 = _stdout;
    }
    else {
      local_b8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_b8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar3 = bs_read_se(b);
    psVar1->seq_scaled_ref_layer_bottom_offset = iVar3;
    if (h264_dbgfile == (FILE *)0x0) {
      local_c0 = _stdout;
    }
    else {
      local_c0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_c0,"sps_svc_ext->seq_scaled_ref_layer_bottom_offset: %d \n",
            (ulong)(uint)psVar1->seq_scaled_ref_layer_bottom_offset);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_c8 = _stdout;
  }
  else {
    local_c8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_c8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u1(b);
  psVar1->seq_tcoeff_level_prediction_flag = uVar2 != 0;
  if (h264_dbgfile == (FILE *)0x0) {
    local_d0 = _stdout;
  }
  else {
    local_d0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_d0,"sps_svc_ext->seq_tcoeff_level_prediction_flag: %d \n",
          (ulong)(psVar1->seq_tcoeff_level_prediction_flag & 1));
  if ((psVar1->seq_tcoeff_level_prediction_flag & 1U) != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_d8 = _stdout;
    }
    else {
      local_d8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_d8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = bs_read_u1(b);
    psVar1->adaptive_tcoeff_level_prediction_flag = uVar2 != 0;
    if (h264_dbgfile == (FILE *)0x0) {
      local_e0 = _stdout;
    }
    else {
      local_e0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_e0,"sps_svc_ext->adaptive_tcoeff_level_prediction_flag: %d \n",
            (ulong)(psVar1->adaptive_tcoeff_level_prediction_flag & 1));
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_e8 = _stdout;
  }
  else {
    local_e8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_e8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = bs_read_u1(b);
  psVar1->slice_header_restriction_flag = uVar2 != 0;
  if (h264_dbgfile == (FILE *)0x0) {
    local_f0 = _stdout;
  }
  else {
    local_f0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_f0,"sps_svc_ext->slice_header_restriction_flag: %d \n",
          (ulong)(psVar1->slice_header_restriction_flag & 1));
  return;
}

Assistant:

void read_debug_seq_parameter_set_svc_extension(sps_subset_t* sps_subset, bs_t* b)
{
    sps_svc_ext_t* sps_svc_ext = sps_subset->sps_svc_ext;
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->inter_layer_deblocking_filter_control_present_flag = bs_read_u1(b); printf("sps_svc_ext->inter_layer_deblocking_filter_control_present_flag: %d \n", sps_svc_ext->inter_layer_deblocking_filter_control_present_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->extended_spatial_scalability_idc = bs_read_u(b, 2); printf("sps_svc_ext->extended_spatial_scalability_idc: %d \n", sps_svc_ext->extended_spatial_scalability_idc); 
    if( sps_subset->sps->chroma_format_idc == 1 || sps_subset->sps->chroma_format_idc == 2 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->chroma_phase_x_plus1_flag = bs_read_u1(b); printf("sps_svc_ext->chroma_phase_x_plus1_flag: %d \n", sps_svc_ext->chroma_phase_x_plus1_flag); 
    }
    if( sps_subset->sps->chroma_format_idc == 1 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->chroma_phase_y_plus1 = bs_read_u(b, 2); printf("sps_svc_ext->chroma_phase_y_plus1: %d \n", sps_svc_ext->chroma_phase_y_plus1); 
    }
    if( sps_svc_ext->extended_spatial_scalability_idc )
    {
        if( sps_subset->sps->chroma_format_idc > 0 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag = bs_read_u1(b); printf("sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag: %d \n", sps_svc_ext->seq_ref_layer_chroma_phase_x_plus1_flag); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1 = bs_read_u(b, 2); printf("sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1: %d \n", sps_svc_ext->seq_ref_layer_chroma_phase_y_plus1); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_left_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_left_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_left_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_top_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_top_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_top_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_right_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_right_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_right_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_scaled_ref_layer_bottom_offset = bs_read_se(b); printf("sps_svc_ext->seq_scaled_ref_layer_bottom_offset: %d \n", sps_svc_ext->seq_scaled_ref_layer_bottom_offset); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->seq_tcoeff_level_prediction_flag = bs_read_u1(b); printf("sps_svc_ext->seq_tcoeff_level_prediction_flag: %d \n", sps_svc_ext->seq_tcoeff_level_prediction_flag); 
    if( sps_svc_ext->seq_tcoeff_level_prediction_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->adaptive_tcoeff_level_prediction_flag = bs_read_u1(b); printf("sps_svc_ext->adaptive_tcoeff_level_prediction_flag: %d \n", sps_svc_ext->adaptive_tcoeff_level_prediction_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps_svc_ext->slice_header_restriction_flag = bs_read_u1(b); printf("sps_svc_ext->slice_header_restriction_flag: %d \n", sps_svc_ext->slice_header_restriction_flag); 
}